

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_node.hpp
# Opt level: O0

bool jsoncons::jsonpath::operator<(basic_path_node<wchar_t> *lhs,basic_path_node<wchar_t> *rhs)

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str;
  unsigned_long *puVar1;
  size_t sVar2;
  basic_path_node<wchar_t> *in_RSI;
  basic_path_node<wchar_t> *in_RDI;
  int diff;
  bool is_less;
  basic_path_node<wchar_t> *p_rhs;
  basic_path_node<wchar_t> *p_lhs;
  size_t len;
  int iVar3;
  uint in_stack_ffffffffffffffc4;
  basic_path_node<wchar_t> *this;
  basic_path_node<wchar_t> *this_00;
  size_t local_28;
  size_t local_20;
  unsigned_long local_18;
  basic_path_node<wchar_t> *local_10;
  basic_path_node<wchar_t> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = basic_path_node<wchar_t>::size(in_RDI);
  local_28 = basic_path_node<wchar_t>::size(local_10);
  puVar1 = std::min<unsigned_long>(&local_20,&local_28);
  local_18 = *puVar1;
  this = local_10;
  this_00 = local_8;
  while( true ) {
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
    sVar2 = basic_path_node<wchar_t>::size(this_00);
    if (sVar2 <= local_18) break;
    this_00 = this_00->parent_;
  }
  while (sVar2 = basic_path_node<wchar_t>::size(this), local_18 < sVar2) {
    this = this->parent_;
    in_stack_ffffffffffffffc4 = CONCAT13(1,(int3)in_stack_ffffffffffffffc4);
  }
  for (; this_00 != (basic_path_node<wchar_t> *)0x0; this_00 = this_00->parent_) {
    iVar3 = 0;
    if (this_00->node_kind_ == this->node_kind_) {
      if (this_00->node_kind_ < index) {
        __str._M_str = (wchar_t *)this_00;
        __str._M_len = (size_t)this;
        iVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                          ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                           ((ulong)in_stack_ffffffffffffffc4 << 0x20),__str);
      }
      else if (this_00->node_kind_ == index) {
        iVar3 = (int)this_00->index_ - (int)this->index_;
      }
    }
    else {
      iVar3 = this_00->node_kind_ - this->node_kind_;
    }
    if (iVar3 < 0) {
      in_stack_ffffffffffffffc4 = CONCAT13(1,(int3)in_stack_ffffffffffffffc4);
    }
    else if (0 < iVar3) {
      in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
    }
    this = this->parent_;
  }
  return (bool)((byte)(in_stack_ffffffffffffffc4 >> 0x18) & 1);
}

Assistant:

bool operator<(const basic_path_node& lhs, const basic_path_node& rhs)
        {
            std::size_t len = (std::min)(lhs.size(),rhs.size());

            const basic_path_node* p_lhs = std::addressof(lhs);
            const basic_path_node* p_rhs = std::addressof(rhs);

            bool is_less = false;
            while (p_lhs->size() > len)
            {
                p_lhs = p_lhs->parent_;
                is_less = false;
            }
            while (p_rhs->size() > len)
            {
                p_rhs = p_rhs->parent_;
                is_less = true;
            }
            while (p_lhs != nullptr)
            {
                int diff = 0;
                if (p_lhs->node_kind_ != p_rhs->node_kind_)
                {
                    diff = static_cast<int>(p_lhs->node_kind_) - static_cast<int>(p_rhs->node_kind_);
                }
                else
                {
                    switch (p_lhs->node_kind_)
                    {
                        case path_node_kind::root:
                        case path_node_kind::name:
                            diff = p_lhs->name_.compare(p_rhs->name_);
                            break;
                        case path_node_kind::index:
                            diff = static_cast<int>(p_lhs->index_) - static_cast<int>(p_rhs->index_);
                            break;
                        default:
                            break;
                    }
                }
                if (diff < 0)
                {
                    is_less = true;
                }
                else if (diff > 0)
                {
                    is_less = false;
                }

                p_lhs = p_lhs->parent_;
                p_rhs = p_rhs->parent_;
            }

            return is_less;
        }